

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::MapValueImmutableClassdName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Descriptor *descriptor,
          ClassNameResolver *name_resolver)

{
  Type TVar1;
  FieldDescriptor *pFVar2;
  LogMessage *other;
  Descriptor *descriptor_00;
  LogFinisher local_9a;
  byte local_99;
  LogMessage local_98;
  allocator local_49;
  string local_48;
  FieldDescriptor *local_28;
  FieldDescriptor *value_field;
  ClassNameResolver *name_resolver_local;
  Descriptor *descriptor_local;
  
  value_field = (FieldDescriptor *)descriptor;
  name_resolver_local = (ClassNameResolver *)this;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"value",&local_49);
  pFVar2 = Descriptor::FindFieldByName((Descriptor *)this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_28 = pFVar2;
  TVar1 = FieldDescriptor::type(pFVar2);
  local_99 = 0;
  if (TVar1 != TYPE_MESSAGE) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message_builder.cc"
               ,0x41);
    local_99 = 1;
    other = internal::LogMessage::operator<<
                      (&local_98,
                       "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (value_field->type()): ");
    internal::LogFinisher::operator=(&local_9a,other);
  }
  if ((local_99 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_98);
  }
  pFVar2 = value_field;
  descriptor_00 = FieldDescriptor::message_type(local_28);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (__return_storage_ptr__,(ClassNameResolver *)pFVar2,descriptor_00);
  return __return_storage_ptr__;
}

Assistant:

std::string MapValueImmutableClassdName(const Descriptor* descriptor,
                                        ClassNameResolver* name_resolver) {
  const FieldDescriptor* value_field = descriptor->FindFieldByName("value");
  GOOGLE_CHECK_EQ(FieldDescriptor::TYPE_MESSAGE, value_field->type());
  return name_resolver->GetImmutableClassName(value_field->message_type());
}